

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_mscomplex.cpp
# Opt level: O2

void __thiscall trimesh::mscomplex_t::cancel_pair(mscomplex_t *this,int p,int q)

{
  pointer piVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  size_type sVar5;
  size_type sVar6;
  ostream *poVar7;
  runtime_error *prVar8;
  int __c;
  int __c_00;
  int q_local;
  int p_local;
  key_type_conflict local_1c0 [8];
  stringstream ss;
  int iStack_19c;
  ostream local_190 [376];
  
  q_local = q;
  p_local = p;
  order_pr_by_cp_index(this,&p_local,&q_local);
  if ((long)(this->m_canc_list).
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->m_canc_list).
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 != (long)this->m_multires_version) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar7 = std::operator<<(local_190,"Failed to ensure condition ");
    poVar7 = std::operator<<(poVar7,"m_multires_version == m_canc_list.size()");
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"at (");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                            );
    poVar7 = std::operator<<(poVar7,",");
    poVar7 = std::operator<<(poVar7,"cancel_pair");
    poVar7 = std::operator<<(poVar7,",");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x137);
    poVar7 = std::operator<<(poVar7,") \n ");
    poVar7 = std::operator<<(poVar7,"Message : ");
    poVar7 = std::operator<<(poVar7,
                             "\"Cannot cancel pair !! Ms complex resolution is not coarsest.\"");
    std::operator<<(poVar7,"\n");
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)local_1c0);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar3 = index(this,(char *)(ulong)(uint)p_local,__c);
  pcVar4 = index(this,(char *)(ulong)(uint)q_local,__c_00);
  if ((int)pcVar3 != (int)pcVar4 + 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar7 = std::operator<<(local_190,"Failed to ensure condition ");
    poVar7 = std::operator<<(poVar7,"index(p) == index(q)+1");
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"at (");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                            );
    poVar7 = std::operator<<(poVar7,",");
    poVar7 = std::operator<<(poVar7,"cancel_pair");
    poVar7 = std::operator<<(poVar7,",");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x139);
    poVar7 = std::operator<<(poVar7,") \n ");
    poVar7 = std::operator<<(poVar7,"Message : ");
    poVar7 = std::operator<<(poVar7,"\"indices do not differ by 1\"");
    std::operator<<(poVar7,"\n");
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)local_1c0);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  piVar1 = (this->m_cp_pair_idx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((piVar1[p_local] != -1) || (piVar1[q_local] != -1)) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar7 = std::operator<<(local_190,"Failed to ensure condition ");
    poVar7 = std::operator<<(poVar7,"m_cp_pair_idx[p] == -1 && m_cp_pair_idx[q] == -1");
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"at (");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                            );
    poVar7 = std::operator<<(poVar7,",");
    poVar7 = std::operator<<(poVar7,"cancel_pair");
    poVar7 = std::operator<<(poVar7,",");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x13b);
    poVar7 = std::operator<<(poVar7,") \n ");
    poVar7 = std::operator<<(poVar7,"Message : ");
    poVar7 = std::operator<<(poVar7,"\"p/q has already been paired\"");
    std::operator<<(poVar7,"\n");
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)local_1c0);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  _ss = q_local;
  sVar5 = std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::count(&(this->m_des_conn->
                   super__Vector_base<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[p_local]._M_t,(key_type_conflict *)&ss
                 );
  local_1c0[0] = p_local;
  sVar6 = std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::count(&(this->m_asc_conn->
                   super__Vector_base<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[q_local]._M_t,local_1c0);
  if (sVar5 != sVar6) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar7 = std::operator<<(local_190,"Failed to ensure condition ");
    poVar7 = std::operator<<(poVar7,"m_des_conn[p].count(q) == m_asc_conn[q].count(p)");
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"at (");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                            );
    poVar7 = std::operator<<(poVar7,",");
    poVar7 = std::operator<<(poVar7,"cancel_pair");
    poVar7 = std::operator<<(poVar7,",");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x13d);
    poVar7 = std::operator<<(poVar7,") \n ");
    poVar7 = std::operator<<(poVar7,"Message : ");
    poVar7 = std::operator<<(poVar7,"\"p is not connected to q\"");
    std::operator<<(poVar7,"\n");
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)local_1c0);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  _ss = q_local;
  sVar5 = std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::count(&(this->m_des_conn->
                   super__Vector_base<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[p_local]._M_t,(key_type_conflict *)&ss
                 );
  if (sVar5 == 1) {
    piVar1 = (this->m_cp_cancno).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = (int)((ulong)((long)(this->m_canc_list).
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_canc_list).
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3);
    piVar1[p_local] = iVar2;
    piVar1[q_local] = iVar2;
    iStack_19c = q_local;
    _ss = p_local;
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<std::pair<int,int>>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->m_canc_list,
               (pair<int,_int> *)&ss);
    cancel_pair(this);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar7 = std::operator<<(local_190,"Failed to ensure condition ");
  poVar7 = std::operator<<(poVar7,"m_des_conn[p].count(q) == 1");
  poVar7 = std::operator<<(poVar7,"\n");
  poVar7 = std::operator<<(poVar7,"at (");
  poVar7 = std::operator<<(poVar7,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                          );
  poVar7 = std::operator<<(poVar7,",");
  poVar7 = std::operator<<(poVar7,"cancel_pair");
  poVar7 = std::operator<<(poVar7,",");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x13f);
  poVar7 = std::operator<<(poVar7,") \n ");
  poVar7 = std::operator<<(poVar7,"Message : ");
  poVar7 = std::operator<<(poVar7,"\"p and q are multiply connected\"");
  std::operator<<(poVar7,"\n");
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar8,(string *)local_1c0);
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void mscomplex_t::cancel_pair ( int p, int q)
{
  order_pr_by_cp_index(*this,p,q);

  ENSURE(m_multires_version == m_canc_list.size(),
         "Cannot cancel pair !! Ms complex resolution is not coarsest.");
  ENSURE(index(p) == index(q)+1,
         "indices do not differ by 1");
  ENSURE(m_cp_pair_idx[p] == -1 && m_cp_pair_idx[q] == -1,
         "p/q has already been paired");
  ENSURE(m_des_conn[p].count(q)  == m_asc_conn[q].count(p),
         "p is not connected to q");
  ENSURE(m_des_conn[p].count(q) == 1,
         "p and q are multiply connected");

  m_cp_cancno[p] = m_canc_list.size();
  m_cp_cancno[q] = m_canc_list.size();
  m_canc_list.push_back(make_pair(p,q));

  cancel_pair();
}